

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qktxhandler.cpp
# Opt level: O2

ssize_t __thiscall QKtxHandler::read(QKtxHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  Data *pDVar1;
  qsizetype qVar2;
  quint32 qVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QLoggingCategory *pQVar11;
  QMap<QByteArray,_QByteArray> *keyValues;
  uint *puVar12;
  uint uVar13;
  _Storage<QMap<QByteArray,_QByteArray>,_false> _Var14;
  char *pcVar15;
  undefined4 in_register_00000034;
  char *pcVar16;
  QArrayDataPointer<char> *pQVar17;
  quint32 end;
  uint offset;
  long in_FS_OFFSET;
  QByteArrayView view;
  initializer_list<unsigned_int> __l;
  QTextureFileData texData;
  QArrayDataPointer<char> local_e0;
  QArrayDataPointer<char> local_c8;
  _Storage<QMap<QByteArray,_QByteArray>,_false> local_a8;
  undefined1 *puStack_a0;
  undefined1 local_98 [4];
  Representation RStack_94;
  quint32 qStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  quint32 qStack_4c;
  undefined8 local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  long local_38;
  
  view.m_size = (QKtxHandler *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((view.m_size)->super_QTextureFileHandler).m_device == (QIODevice *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      return (ssize_t)this;
    }
    goto LAB_004bbf1d;
  }
  pQVar17 = &local_c8;
  local_c8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QIODevice::readAll();
  if (local_c8.size._4_4_ == 0) {
    local_78[0] = '\0';
    local_78[1] = '\0';
    local_78[2] = '\0';
    local_78[3] = '\0';
    local_78[4] = '\0';
    local_78[5] = '\0';
    local_78[6] = '\0';
    local_78[7] = '\0';
    local_78[8] = '\0';
    local_78[9] = '\0';
    local_78[10] = '\0';
    local_78[0xb] = '\0';
    local_78._12_4_ = 0;
    local_78._16_4_ = 0;
    local_78._20_4_ = 0;
    bVar5 = canRead((QByteArray *)pQVar17,(QByteArray *)&local_c8);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_78);
    if (!bVar5) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        unique0x00012000 = pQVar11->name;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        local_98 = SUB84(pDVar1,0);
        RStack_94.m_i = (int)((ulong)pDVar1 >> 0x20);
        pcVar15 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        qStack_90 = (quint32)pcVar15;
        uStack_8c = (undefined4)((ulong)pcVar15 >> 0x20);
        qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
        uStack_88 = (undefined4)qVar2;
        uStack_84 = (undefined4)((ulong)qVar2 >> 0x20);
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)&QByteArray::_empty;
        }
        pcVar16 = "Invalid KTX file %s";
        goto LAB_004bba04;
      }
      goto LAB_004bb6bc;
    }
    if ((ulong)local_c8.size < (undefined1 *)0x40) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        unique0x00012000 = pQVar11->name;
        pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        local_98 = SUB84(pDVar1,0);
        RStack_94.m_i = (int)((ulong)pDVar1 >> 0x20);
        pcVar15 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        qStack_90 = (quint32)pcVar15;
        uStack_8c = (undefined4)((ulong)pcVar15 >> 0x20);
        qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
        uStack_88 = (undefined4)qVar2;
        uStack_84 = (undefined4)((ulong)qVar2 >> 0x20);
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)&QByteArray::_empty;
        }
        pcVar16 = "Invalid KTX header size in %s";
        goto LAB_004bba04;
      }
      goto LAB_004bb6bc;
    }
    pcVar15 = local_c8.ptr;
    if (local_c8.ptr == (char *)0x0) {
      pcVar15 = (char *)&QByteArray::_empty;
    }
    unique0x10000788 = *(char **)(pcVar15 + 0x18);
    _local_58 = *(undefined8 *)(pcVar15 + 0x20);
    _uStack_50 = *(undefined8 *)(pcVar15 + 0x28);
    local_48 = *(undefined8 *)(pcVar15 + 0x30);
    _uStack_40 = *(undefined8 *)(pcVar15 + 0x38);
    local_78._0_4_ = (undefined4)*(undefined8 *)pcVar15;
    local_78._4_4_ = (undefined4)((ulong)*(undefined8 *)pcVar15 >> 0x20);
    local_78._8_4_ = (undefined4)*(undefined8 *)(pcVar15 + 8);
    local_78._12_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar15 + 8) >> 0x20);
    local_78._16_4_ = (undefined4)*(undefined8 *)(pcVar15 + 0x10);
    local_78._20_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar15 + 0x10) >> 0x20);
    bVar5 = checkHeader(view.m_size,(KTXHeader *)local_78);
    if (!bVar5) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
      goto LAB_004bb6bc;
      local_80 = pQVar11->name;
      local_98 = (undefined1  [4])0x2;
      RStack_94.m_i = 0;
      qStack_90 = 0;
      uStack_8c = 0;
      uStack_88 = 0;
      uStack_84 = 0;
      local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
      local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
      local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
      if (local_e0.d != (Data *)0x0) {
        LOCK();
        ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcVar15 = local_e0.ptr;
      if (local_e0.ptr == (char *)0x0) {
        pcVar15 = (char *)&QByteArray::_empty;
      }
      QMessageLogger::warning(local_98,"Unsupported KTX file format in %s",pcVar15);
      pQVar17 = &local_e0;
      goto LAB_004bba18;
    }
    texData.d.d.ptr = (QSharedDataPointer<QTextureFileDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextureFileData::QTextureFileData(&texData,ByteArrayMode);
    QTextureFileData::setData(&texData,(QByteArray *)&local_c8);
    uVar13 = uStack_54;
    uVar7 = uStack_50;
    bVar5 = (view.m_size)->inverseEndian == false;
    local_98 = (undefined1  [4])
               (uStack_54 >> 0x18 | (uStack_54 & 0xff0000) >> 8 | (uStack_54 & 0xff00) << 8 |
               uStack_54 << 0x18);
    if (bVar5) {
      local_98 = (undefined1  [4])uStack_54;
    }
    RStack_94.m_i =
         uStack_50 >> 0x18 | (uStack_50 & 0xff0000) >> 8 | (uStack_50 & 0xff00) << 8 |
         uStack_50 << 0x18;
    if (bVar5) {
      RStack_94.m_i = uStack_50;
    }
    QTextureFileData::setSize(&texData,(QSize *)local_98);
    qVar3 = (uint)local_78._24_4_ >> 0x18 | (local_78._24_4_ & 0xff0000) >> 8 |
            (local_78._24_4_ & 0xff00) << 8 | local_78._24_4_ << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = local_78._24_4_;
    }
    QTextureFileData::setGLFormat(&texData,qVar3);
    qVar3 = uStack_5c >> 0x18 | (uStack_5c & 0xff0000) >> 8 | (uStack_5c & 0xff00) << 8 |
            uStack_5c << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = uStack_5c;
    }
    QTextureFileData::setGLInternalFormat(&texData,qVar3);
    qVar3 = local_58 >> 0x18 | (local_58 & 0xff0000) >> 8 | (local_58 & 0xff00) << 8 |
            local_58 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      qVar3 = local_58;
    }
    QTextureFileData::setGLBaseInternalFormat(&texData,qVar3);
    uVar6 = uStack_40 >> 0x18 | (uStack_40 & 0xff0000) >> 8 | (uStack_40 & 0xff00) << 8 |
            uStack_40 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar6 = uStack_40;
    }
    QTextureFileData::setNumLevels(&texData,uVar6);
    uVar6 = uStack_44 >> 0x18 | (uStack_44 & 0xff0000) >> 8 | (uStack_44 & 0xff00) << 8 |
            uStack_44 << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar6 = uStack_44;
    }
    QTextureFileData::setNumFaces(&texData,uVar6);
    uVar6 = uStack_3c >> 0x18 | (uStack_3c & 0xff0000) >> 8 | (uStack_3c & 0xff00) << 8 |
            uStack_3c << 0x18;
    if ((view.m_size)->inverseEndian == false) {
      uVar6 = uStack_3c;
    }
    offset = uVar6 + 0x40;
    if (0xffffffbf < uVar6) {
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
      goto LAB_004bbc26;
      local_80 = pQVar11->name;
      local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
      local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
      local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
      if (local_e0.d != (Data *)0x0) {
        LOCK();
        ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pcVar15 = local_e0.ptr;
      if (local_e0.ptr == (char *)0x0) {
        pcVar15 = (char *)&QByteArray::_empty;
      }
      pcVar16 = "Overflow in size of key value data in header of KTX file %s";
      goto LAB_004bbdb2;
    }
    if (offset < (uint)local_c8.size) {
      if (uVar6 == 0) {
LAB_004bba5f:
        qStack_90 = qStack_4c;
        __l._M_len = 3;
        __l._M_array = (iterator)local_98;
        local_98 = (undefined1  [4])uVar13;
        RStack_94.m_i = uVar7;
        uVar7 = std::max<unsigned_int>(__l);
        uVar13 = 0x20;
        if (uVar7 != 0) {
          uVar13 = 0x1f;
          if (uVar7 != 0) {
            for (; uVar7 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar13 = uVar13 ^ 0x1f;
        }
        iVar8 = QTextureFileData::numLevels(&texData);
        if ((int)(0x20 - uVar13) < iVar8) {
          pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
          if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
            local_80 = pQVar11->name;
            local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
            local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
            local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
            if (local_e0.d != (Data *)0x0) {
              LOCK();
              ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pcVar15 = local_e0.ptr;
            if (local_e0.ptr == (char *)0x0) {
              pcVar15 = (char *)&QByteArray::_empty;
            }
            pcVar16 = "Too many levels in KTX file %s";
LAB_004bbdb2:
            uStack_88 = 0;
            uStack_8c = 0;
            qStack_90 = 0;
            RStack_94.m_i = 0;
            uStack_84 = 0;
            local_98 = (undefined1  [4])0x2;
            QMessageLogger::warning(local_98,pcVar16,pcVar15);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_e0);
          }
        }
        else {
          iVar8 = QTextureFileData::numFaces(&texData);
          if ((iVar8 == 1) || (iVar8 = QTextureFileData::numFaces(&texData), iVar8 == 6)) {
            for (iVar8 = 0; iVar9 = QTextureFileData::numLevels(&texData), iVar8 < iVar9;
                iVar8 = iVar8 + 1) {
              if ((0xfffffffb < offset) || ((uint)local_c8.size < offset + 4)) goto LAB_004bbc15;
              uVar13 = *(uint *)(local_c8.ptr + offset);
              uVar7 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 |
                      uVar13 << 0x18;
              if ((view.m_size)->inverseEndian == false) {
                uVar7 = uVar13;
              }
              _Var14 = (_Storage<QMap<QByteArray,_QByteArray>,_false>)
                       ((ulong)CONCAT14(0xfffffffc >= uVar7,uVar7 + 3) & 0xfffffffffffffffc);
              iVar9 = 0;
              offset = offset + 4;
              while( true ) {
                iVar10 = QTextureFileData::numFaces(&texData);
                if (iVar10 <= iVar9) break;
                QTextureFileData::setDataOffset(&texData,offset,iVar8,iVar9);
                QTextureFileData::setDataLength(&texData,uVar7,iVar8,iVar9);
                local_a8 = _Var14;
                if (0xfffffffc < uVar7) {
                  pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                  if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
                  goto LAB_004bbc26;
                  local_80 = pQVar11->name;
                  local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
                  local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
                  local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
                  if (local_e0.d != (Data *)0x0) {
                    LOCK();
                    ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + 1;
                    UNLOCK();
                  }
                  pcVar15 = local_e0.ptr;
                  if (local_e0.ptr == (char *)0x0) {
                    pcVar15 = (char *)&QByteArray::_empty;
                  }
                  pcVar16 = "Overflow in KTX file %s";
                  goto LAB_004bbdb2;
                }
                puVar12 = std::
                          _Optional_base_impl<unsigned_int,_std::_Optional_base<unsigned_int,_true,_true>_>
                          ::_M_get((_Optional_base_impl<unsigned_int,_std::_Optional_base<unsigned_int,_true,_true>_>
                                    *)&local_a8._M_value);
                bVar5 = CARRY4(offset,*puVar12);
                offset = offset + *puVar12;
                if (bVar5) {
                  pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
                  if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) == 0)
                  goto LAB_004bbc26;
                  local_80 = pQVar11->name;
                  goto LAB_004bbd6f;
                }
                iVar9 = iVar9 + 1;
              }
            }
            bVar5 = QTextureFileData::isValid(&texData);
            if (bVar5) {
              pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              local_98 = SUB84(pDVar1,0);
              RStack_94.m_i = (int)((ulong)pDVar1 >> 0x20);
              pcVar15 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              qStack_90 = (quint32)pcVar15;
              uStack_8c = (undefined4)((ulong)pcVar15 >> 0x20);
              qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
              uStack_88 = (undefined4)qVar2;
              uStack_84 = (undefined4)((ulong)qVar2 >> 0x20);
              if (pDVar1 != (Data *)0x0) {
                LOCK();
                (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
                UNLOCK();
              }
              QTextureFileData::setLogName(&texData,(QByteArray *)local_98);
              QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_98);
              QTextureFileData::QTextureFileData((QTextureFileData *)this,&texData);
              goto LAB_004bbc30;
            }
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar11->name;
              local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
              if (local_e0.d != (Data *)0x0) {
                LOCK();
                ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              pcVar15 = local_e0.ptr;
              if (local_e0.ptr == (char *)0x0) {
                pcVar15 = (char *)&QByteArray::_empty;
              }
              pcVar16 = "Invalid values in header of KTX file %s";
              goto LAB_004bbdb2;
            }
          }
          else {
            pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
            if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
              local_80 = pQVar11->name;
              local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
              local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
              local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
              if (local_e0.d != (Data *)0x0) {
                LOCK();
                ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              pcVar15 = local_e0.ptr;
              if (local_e0.ptr == (char *)0x0) {
                pcVar15 = (char *)&QByteArray::_empty;
              }
              pcVar16 = "Invalid number of faces in KTX file %s";
              goto LAB_004bbdb2;
            }
          }
        }
        goto LAB_004bbc26;
      }
      local_a8 = (_Storage<QMap<QByteArray,_QByteArray>,_false>)&DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      view.m_data._0_4_ = uVar6;
      view.m_data._4_4_ = 0;
      decodeKeyValues((QKtxHandler *)&local_a8._M_value,view);
      cVar4 = (char)puStack_a0;
      if ((char)puStack_a0 == '\0') {
        pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
        if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_80 = pQVar11->name;
          local_98 = (undefined1  [4])0x2;
          RStack_94.m_i = 0;
          qStack_90 = 0;
          uStack_8c = 0;
          uStack_88 = 0;
          uStack_84 = 0;
          local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
          local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
          local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
          if (local_e0.d != (Data *)0x0) {
            LOCK();
            ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pcVar15 = local_e0.ptr;
          if (local_e0.ptr == (char *)0x0) {
            pcVar15 = (char *)&QByteArray::_empty;
          }
          QMessageLogger::warning(local_98,"Could not parse key values in KTX file %s",pcVar15);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_e0);
        }
        QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
      }
      else {
        keyValues = std::
                    _Optional_base_impl<QMap<QByteArray,_QByteArray>,_std::_Optional_base<QMap<QByteArray,_QByteArray>,_false,_false>_>
                    ::_M_get((_Optional_base_impl<QMap<QByteArray,_QByteArray>,_std::_Optional_base<QMap<QByteArray,_QByteArray>,_false,_false>_>
                              *)&local_a8._M_value);
        QTextureFileData::setKeyValueMetadata(&texData,keyValues);
      }
      std::_Optional_payload_base<QMap<QByteArray,_QByteArray>_>::_M_reset
                ((_Optional_payload_base<QMap<QByteArray,_QByteArray>_> *)&local_a8._M_value);
      if (cVar4 != '\0') {
        uVar13 = uStack_54;
        uVar7 = uStack_50;
        goto LAB_004bba5f;
      }
    }
    else {
LAB_004bbc15:
      pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
      if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_80 = pQVar11->name;
LAB_004bbd6f:
        local_e0.d = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
        local_e0.ptr = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
        local_e0.size = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
        if (local_e0.d != (Data *)0x0) {
          LOCK();
          ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_e0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        pcVar15 = local_e0.ptr;
        if (local_e0.ptr == (char *)0x0) {
          pcVar15 = (char *)&QByteArray::_empty;
        }
        pcVar16 = "OOB request in KTX file %s";
        goto LAB_004bbdb2;
      }
LAB_004bbc26:
      QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
    }
LAB_004bbc30:
    QTextureFileData::~QTextureFileData(&texData);
  }
  else {
    pQVar11 = QtPrivateLogging::lcQtGuiTextureIO();
    if (((pQVar11->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      unique0x00012000 = pQVar11->name;
      pDVar1 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.d;
      local_98 = SUB84(pDVar1,0);
      RStack_94.m_i = (int)((ulong)pDVar1 >> 0x20);
      pcVar15 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.ptr;
      qStack_90 = (quint32)pcVar15;
      uStack_8c = (undefined4)((ulong)pcVar15 >> 0x20);
      qVar2 = ((view.m_size)->super_QTextureFileHandler).m_logName.d.size;
      uStack_88 = (undefined4)qVar2;
      uStack_84 = (undefined4)((ulong)qVar2 >> 0x20);
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (pcVar15 == (char *)0x0) {
        pcVar15 = (char *)&QByteArray::_empty;
      }
      pcVar16 = "Too big KTX file %s";
LAB_004bba04:
      local_78._20_4_ = 0;
      local_78._16_4_ = 0;
      local_78._12_4_ = 0;
      local_78[8] = '\0';
      local_78[9] = '\0';
      local_78[10] = '\0';
      local_78[0xb] = '\0';
      local_78[4] = '\0';
      local_78[5] = '\0';
      local_78[6] = '\0';
      local_78[7] = '\0';
      local_78[0] = '\x02';
      local_78[1] = '\0';
      local_78[2] = '\0';
      local_78[3] = '\0';
      QMessageLogger::warning(local_78,pcVar16,pcVar15);
      pQVar17 = (QArrayDataPointer<char> *)local_98;
LAB_004bba18:
      QArrayDataPointer<char>::~QArrayDataPointer(pQVar17);
    }
LAB_004bb6bc:
    QTextureFileData::QTextureFileData((QTextureFileData *)this,ByteArrayMode);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (ssize_t)this;
  }
LAB_004bbf1d:
  __stack_chk_fail();
}

Assistant:

QTextureFileData QKtxHandler::read()
{
    if (!device())
        return QTextureFileData();

    const QByteArray buf = device()->readAll();
    if (static_cast<size_t>(buf.size()) > std::numeric_limits<quint32>::max()) {
        qCWarning(lcQtGuiTextureIO, "Too big KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (!canRead(QByteArray(), buf)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (buf.size() < qsizetype(qktxh_headerSize)) {
        qCWarning(lcQtGuiTextureIO, "Invalid KTX header size in %s", logName().constData());
        return QTextureFileData();
    }

    KTXHeader header;
    memcpy(&header, buf.data(), qktxh_headerSize);
    if (!checkHeader(header)) {
        qCWarning(lcQtGuiTextureIO, "Unsupported KTX file format in %s", logName().constData());
        return QTextureFileData();
    }

    QTextureFileData texData;
    texData.setData(buf);

    texData.setSize(QSize(decode(header.pixelWidth), decode(header.pixelHeight)));
    texData.setGLFormat(decode(header.glFormat));
    texData.setGLInternalFormat(decode(header.glInternalFormat));
    texData.setGLBaseInternalFormat(decode(header.glBaseInternalFormat));

    texData.setNumLevels(decode(header.numberOfMipmapLevels));
    texData.setNumFaces(decode(header.numberOfFaces));

    const quint32 bytesOfKeyValueData = decode(header.bytesOfKeyValueData);
    quint32 headerKeyValueSize;
    if (qAddOverflow(qktxh_headerSize, bytesOfKeyValueData, &headerKeyValueSize)) {
        qCWarning(lcQtGuiTextureIO, "Overflow in size of key value data in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    if (headerKeyValueSize >= quint32(buf.size())) {
        qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    // File contains key/values
    if (bytesOfKeyValueData > 0) {
        auto keyValueDataView = safeView(buf, qktxh_headerSize, bytesOfKeyValueData);
        if (keyValueDataView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "Invalid view in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        auto keyValues = decodeKeyValues(keyValueDataView);
        if (!keyValues) {
            qCWarning(lcQtGuiTextureIO, "Could not parse key values in KTX file %s",
                     logName().constData());
            return QTextureFileData();
        }

        texData.setKeyValueMetadata(*keyValues);
    }

    // Technically, any number of levels is allowed but if the value is bigger than
    // what is possible in KTX V2 (and what makes sense) we return an error.
    // maxLevels = log2(max(width, height, depth))
    const int maxLevels = (sizeof(quint32) * 8)
            - qCountLeadingZeroBits(std::max(
                    { header.pixelWidth, header.pixelHeight, header.pixelDepth }));

    if (texData.numLevels() > maxLevels) {
        qCWarning(lcQtGuiTextureIO, "Too many levels in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    if (texData.numFaces() != 1 && texData.numFaces() != 6) {
        qCWarning(lcQtGuiTextureIO, "Invalid number of faces in KTX file %s", logName().constData());
        return QTextureFileData();
    }

    quint32 offset = headerKeyValueSize;
    for (int level = 0; level < texData.numLevels(); level++) {
        const auto imageSizeView = safeView(buf, offset, sizeof(quint32));
        if (imageSizeView.isEmpty()) {
            qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
            return QTextureFileData();
        }

        const quint32 imageSize = decode(qFromUnaligned<quint32>(imageSizeView.data()));
        offset += sizeof(quint32); // overflow checked indirectly above

        for (int face = 0; face < texData.numFaces(); face++) {
            texData.setDataOffset(offset, level, face);
            texData.setDataLength(imageSize, level, face);

            // Add image data and padding to offset
            const auto padded = nearestMultipleOf4(imageSize);
            if (!padded) {
                qCWarning(lcQtGuiTextureIO, "Overflow in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            quint32 offsetNext;
            if (qAddOverflow(offset, *padded, &offsetNext)) {
                qCWarning(lcQtGuiTextureIO, "OOB request in KTX file %s", logName().constData());
                return QTextureFileData();
            }

            offset = offsetNext;
        }
    }

    if (!texData.isValid()) {
        qCWarning(lcQtGuiTextureIO, "Invalid values in header of KTX file %s",
                 logName().constData());
        return QTextureFileData();
    }

    texData.setLogName(logName());

#ifdef KTX_DEBUG
    qDebug() << "KTX file handler read" << texData;
#endif

    return texData;
}